

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

DCSFileNameHeader * lrit::getHeader<lrit::DCSFileNameHeader>(Buffer *b,int pos)

{
  size_t in_RCX;
  HeaderReader<lrit::DCSFileNameHeader> *in_RDI;
  HeaderReader<lrit::DCSFileNameHeader> r;
  DCSFileNameHeader *h;
  Buffer *in_stack_ffffffffffffff78;
  HeaderReader<lrit::DCSFileNameHeader> *this;
  HeaderReader<lrit::DCSFileNameHeader> local_50;
  
  this = in_RDI;
  HeaderReader<lrit::DCSFileNameHeader>::HeaderReader(in_RDI,in_stack_ffffffffffffff78,0);
  HeaderReader<lrit::DCSFileNameHeader>::getHeader(this);
  HeaderReader<lrit::DCSFileNameHeader>::read
            (&local_50,(int)this + 8,(void *)(long)(int)(*(ushort *)((long)&this->b_ + 2) - 3),
             in_RCX);
  HeaderReader<lrit::DCSFileNameHeader>::~HeaderReader
            ((HeaderReader<lrit::DCSFileNameHeader> *)0x117bf1);
  return (DCSFileNameHeader *)in_RDI;
}

Assistant:

DCSFileNameHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<DCSFileNameHeader>(b, pos);
  auto h = r.getHeader();
  r.read(h.fileName, h.headerLength - 3);
  return h;
}